

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseXMLParser.cpp
# Opt level: O2

bool __thiscall
Rml::BaseXMLParser::ReadAttributes
          (BaseXMLParser *this,XMLAttributes *attributes,bool *parse_raw_xml_content)

{
  bool bVar1;
  size_t sVar2;
  type this_00;
  byte unaff_BL;
  String value;
  String attribute;
  String local_50;
  
  do {
    attribute._M_dataplus._M_p = (pointer)&attribute.field_2;
    attribute._M_string_length = 0;
    attribute.field_2._M_local_buf[0] = '\0';
    value._M_dataplus._M_p = (pointer)&value.field_2;
    value._M_string_length = 0;
    value.field_2._M_local_buf[0] = '\0';
    bVar1 = FindWord(this,&attribute,"=/>");
    if (bVar1) {
      bVar1 = PeekString(this,"=",true);
      if (bVar1) {
        bVar1 = PeekString(this,"\"",true);
        if (bVar1) {
          bVar1 = FindString(this,"\"",&value,false);
        }
        else {
          bVar1 = PeekString(this,"\'",true);
          if (bVar1) {
            bVar1 = FindString(this,"\'",&value,false);
          }
          else {
            bVar1 = FindWord(this,&value,"/>");
          }
        }
        if (bVar1 == false) goto LAB_002525d2;
      }
      sVar2 = itlib::
              flat_set<std::__cxx11::string,itlib::fsimpl::less,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ::count<std::__cxx11::string>
                        ((flat_set<std::__cxx11::string,itlib::fsimpl::less,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          *)&this->attributes_for_inner_xml_data,&attribute);
      if (sVar2 == 1) {
        *parse_raw_xml_content = true;
      }
      StringUtilities::DecodeRml(&local_50,&value);
      this_00 = itlib::
                flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                ::operator[]<std::__cxx11::string&>
                          ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                            *)attributes,&attribute);
      Variant::operator=(this_00,&local_50);
      ::std::__cxx11::string::~string((string *)&local_50);
      bVar1 = PeekString(this,"/",false);
      if (bVar1) {
        unaff_BL = 1;
        goto LAB_002525d4;
      }
      bVar1 = PeekString(this,">",false);
      unaff_BL = unaff_BL | bVar1;
      bVar1 = !bVar1;
    }
    else {
LAB_002525d2:
      unaff_BL = 0;
LAB_002525d4:
      bVar1 = false;
    }
    ::std::__cxx11::string::~string((string *)&value);
    ::std::__cxx11::string::~string((string *)&attribute);
    if (!bVar1) {
      return (bool)(unaff_BL & 1);
    }
  } while( true );
}

Assistant:

bool BaseXMLParser::ReadAttributes(XMLAttributes& attributes, bool& parse_raw_xml_content)
{
	for (;;)
	{
		String attribute;
		String value;

		// Get the attribute name
		if (!FindWord(attribute, "=/>"))
		{
			return false;
		}

		// Check if theres an assigned value
		if (PeekString("="))
		{
			if (PeekString("\""))
			{
				if (!FindString("\"", value))
					return false;
			}
			else if (PeekString("'"))
			{
				if (!FindString("'", value))
					return false;
			}
			else if (!FindWord(value, "/>"))
			{
				return false;
			}
		}

		if (attributes_for_inner_xml_data.count(attribute) == 1)
			parse_raw_xml_content = true;

		attributes[attribute] = StringUtilities::DecodeRml(value);

		// Check for the end of the tag.
		if (PeekString("/", false) || PeekString(">", false))
			return true;
	}
}